

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O0

fdb_status
wal_txn_migration(void *dbhandle,void *new_dhandle,filemgr *old_file,filemgr *new_file,
                 wal_doc_move_func *move_doc)

{
  ulong uVar1;
  byte bVar2;
  list_elem *plVar3;
  avl_node *paVar4;
  list_elem *plVar5;
  long in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  code *in_R8;
  size_t shard_num;
  _fdb_key_cmp_info cmp_info;
  uint64_t mem_overhead;
  size_t num_shards;
  size_t i;
  list_elem *e;
  avl_node *node;
  wal_item *item;
  wal_item_header *header;
  wal_txn_wrapper *txn_wrapper;
  fdb_txn *txn;
  fdb_doc doc;
  int64_t offset;
  undefined4 in_stack_fffffffffffffef8;
  memory_order in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  fdb_doc *in_stack_ffffffffffffff08;
  _fdb_key_cmp_info *in_stack_ffffffffffffff10;
  int line;
  filemgr *in_stack_ffffffffffffff18;
  fdb_txn *in_stack_ffffffffffffff20;
  avl_node *in_stack_ffffffffffffff28;
  avl_tree *tree;
  ulong local_c0;
  list_elem *local_b8;
  avl_node *local_b0;
  undefined1 local_88 [32];
  void *local_68;
  void *local_50;
  void *local_48;
  long local_38;
  code *local_30;
  long local_28;
  long local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_c0 = 0;
  uVar1 = *(ulong *)(*(long *)(in_RDX + 0x48) + 0x48);
  tree = (avl_tree *)0x0;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  do {
    if (uVar1 <= local_c0) {
      atomic_sub_uint64_t((atomic<unsigned_long> *)
                          CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                          CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                          memory_order_relaxed);
      pthread_spin_lock((pthread_spinlock_t *)(*(long *)(local_20 + 0x48) + 0x60));
      local_b8 = list_begin((list *)(*(long *)(local_20 + 0x48) + 0x20));
      while (local_b8 != (list_elem *)0x0) {
        plVar3 = local_b8[1].prev;
        if (plVar3 == (list_elem *)(local_20 + 0x130)) {
          local_b8 = list_next(local_b8);
        }
        else {
          plVar5 = list_remove((list *)(*(long *)(local_20 + 0x48) + 0x20),local_b8);
          list_push_front((list *)(*(long *)(local_28 + 0x48) + 0x20),local_b8);
          plVar3[1].prev = (list_elem *)0xffffffffffffffff;
          plVar3[1].next = (list_elem *)0x0;
          local_b8 = plVar5;
        }
      }
      pthread_spin_unlock((pthread_spinlock_t *)(*(long *)(local_20 + 0x48) + 0x60));
      return FDB_RESULT_SUCCESS;
    }
    pthread_spin_lock((pthread_spinlock_t *)
                      (*(long *)(*(long *)(local_20 + 0x48) + 0x38) + local_c0 * 0x18 + 0x10));
    local_b0 = avl_first((avl_tree *)
                         (*(long *)(*(long *)(local_20 + 0x48) + 0x38) + local_c0 * 0x18));
    while (local_b0 != (avl_node *)0x0) {
      local_b8 = list_end((list *)&local_b0[1].right);
      while (local_b8 != (list_elem *)0x0) {
        bVar2 = std::__atomic_base::operator_cast_to_unsigned_char
                          ((__atomic_base<unsigned_char> *)in_stack_ffffffffffffff08);
        line = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
        if ((bVar2 & 1) == 0) {
          local_38 = (*local_30)(local_10,local_18,local_b8,local_88);
          if (local_38 < 1) {
            pthread_spin_unlock((pthread_spinlock_t *)
                                (*(long *)(*(long *)(local_20 + 0x48) + 0x38) + local_c0 * 0x18 +
                                0x10));
            if (local_38 < 0) {
              return (fdb_status)local_38;
            }
            return FDB_RESULT_READ_FAIL;
          }
          if (local_b8[3].prev == (list_elem *)(local_20 + 0x130)) {
            fdb_assert_die((char *)in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18,line,
                           (uint64_t)in_stack_ffffffffffffff08,
                           CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
          }
          plVar3 = (local_b8[3].prev)->prev;
          in_stack_ffffffffffffff10 = (_fdb_key_cmp_info *)plVar3->prev;
          in_stack_ffffffffffffff18 = (filemgr *)plVar3->next;
          in_stack_ffffffffffffff20 = (fdb_txn *)plVar3[1].prev;
          in_stack_ffffffffffffff28 = (avl_node *)(local_b8[3].prev)->prev[1].next;
          wal_insert(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                     in_stack_ffffffffffffff08,
                     CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     in_stack_fffffffffffffefc);
          if (*(char *)(*(long *)(local_20 + 0x110) + 0x11) == '\x01') {
            in_stack_ffffffffffffff08 = (fdb_doc *)((ulong)local_b8[5].next % uVar1);
            pthread_spin_lock((pthread_spinlock_t *)
                              (*(long *)(*(long *)(local_20 + 0x48) + 0x40) +
                               (long)in_stack_ffffffffffffff08 * 0x18 + 0x10));
            avl_remove(tree,in_stack_ffffffffffffff28);
            pthread_spin_unlock((pthread_spinlock_t *)
                                (*(long *)(*(long *)(local_20 + 0x48) + 0x40) +
                                 (long)in_stack_ffffffffffffff08 * 0x18 + 0x10));
          }
          plVar3 = list_remove_reverse((list *)&local_b0[1].right,local_b8);
          list_remove((list *)local_b8[3].prev[2].prev,(list_elem *)&local_b8[6].next);
          if (local_b8[3].next == *(list_elem **)(local_20 + 0x138)) {
            atomic_decr_uint32_t
                      ((atomic<unsigned_int> *)
                       CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                       in_stack_fffffffffffffefc);
          }
          if (*(char *)&local_b8[4].next != '\x02') {
            atomic_sub_uint64_t((atomic<unsigned_long> *)
                                CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                                CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                memory_order_relaxed);
          }
          free(local_b8);
          free(local_68);
          free(local_50);
          free(local_48);
          atomic_decr_uint32_t
                    ((atomic<unsigned_int> *)
                     CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     in_stack_fffffffffffffefc);
          tree = tree + 8;
          local_b8 = plVar3;
        }
        else {
          local_b8 = list_prev(local_b8);
        }
      }
      plVar3 = list_begin((list *)&local_b0[1].right);
      if (plVar3 == (list_elem *)0x0) {
        paVar4 = avl_next(local_b0);
        avl_remove(tree,in_stack_ffffffffffffff28);
        tree = (avl_tree *)((long)&tree[3].aux + (ulong)*(ushort *)&local_b0[1].left);
        free(local_b0[1].parent);
        free(local_b0);
        local_b0 = paVar4;
      }
      else {
        local_b0 = avl_next(local_b0);
      }
    }
    pthread_spin_unlock((pthread_spinlock_t *)
                        (*(long *)(*(long *)(local_20 + 0x48) + 0x38) + local_c0 * 0x18 + 0x10));
    local_c0 = local_c0 + 1;
  } while( true );
}

Assistant:

fdb_status wal_txn_migration(void *dbhandle,
                             void *new_dhandle,
                             struct filemgr *old_file,
                             struct filemgr *new_file,
                             wal_doc_move_func *move_doc)
{
    int64_t offset;
    fdb_doc doc;
    fdb_txn *txn;
    struct wal_txn_wrapper *txn_wrapper;
    struct wal_item_header *header;
    struct wal_item *item;
    struct avl_node *node;
    struct list_elem *e;
    size_t i = 0;
    size_t num_shards = old_file->wal->num_shards;
    uint64_t mem_overhead = 0;
    struct _fdb_key_cmp_info cmp_info;

    // Note that the caller (i.e., compactor) alreay owns the locks on
    // both old_file and new_file filemgr instances. Therefore, it is OK to
    // grab each partition lock individually and move all uncommitted items
    // to the new_file filemgr instance.

    for (; i < num_shards; ++i) {
        spin_lock(&old_file->wal->key_shards[i].lock);
        node = avl_first(&old_file->wal->key_shards[i]._map);
        while(node) {
            header = _get_entry(node, struct wal_item_header, avl_key);
            e = list_end(&header->items);
            while(e) {
                item = _get_entry(e, struct wal_item, list_elem);
                if (!(item->flag & WAL_ITEM_COMMITTED)) {
                    // not committed yet
                    // move doc
                    offset = move_doc(dbhandle, new_dhandle, item, &doc);
                    if (offset <= 0) {
                        spin_unlock(&old_file->wal->key_shards[i].lock);
                        return offset < 0 ? (fdb_status) offset : FDB_RESULT_READ_FAIL;
                    }
                    // Note that all items belonging to global_txn should be
                    // flushed before calling this function
                    // (migrate transactional items only).
                    fdb_assert(item->txn != &old_file->global_txn,
                               (uint64_t)item->txn, 0);
                    cmp_info.kvs_config = item->txn->handle->kvs_config;
                    cmp_info.kvs = item->txn->handle->kvs;
                    // insert into new_file's WAL
                    wal_insert(item->txn, new_file, &cmp_info, &doc, offset,
                               WAL_INS_WRITER);

                    if (old_file->config->seqtree_opt == FDB_SEQTREE_USE) {
                        // remove from seq map
                        size_t shard_num = item->seqnum % num_shards;
                        spin_lock(&old_file->wal->seq_shards[shard_num].lock);
                        avl_remove(&old_file->wal->seq_shards[shard_num]._map,
                                &item->avl_seq);
                        spin_unlock(&old_file->wal->seq_shards[shard_num].lock);
                    }

                    // remove from header's list
                    e = list_remove_reverse(&header->items, e);
                    // remove from transaction's list
                    list_remove(item->txn->items, &item->list_elem_txn);
                    // decrease num_flushable of old_file if non-transactional update
                    if (item->txn_id == old_file->global_txn.txn_id) {
                        atomic_decr_uint32_t(&old_file->wal->num_flushable);
                    }
                    if (item->action != WAL_ACT_REMOVE) {
                        atomic_sub_uint64_t(&old_file->wal->datasize, item->doc_size,
                                            std::memory_order_relaxed);
                    }
                    // free item
                    free(item);
                    // free doc
                    free(doc.key);
                    free(doc.meta);
                    free(doc.body);
                    atomic_decr_uint32_t(&old_file->wal->size);
                    mem_overhead += sizeof(struct wal_item);
                } else {
                    e = list_prev(e);
                }
            }

            if (list_begin(&header->items) == NULL) {
                // header's list becomes empty
                // remove from key map
                node = avl_next(node);
                avl_remove(&old_file->wal->key_shards[i]._map,
                           &header->avl_key);
                mem_overhead += header->keylen + sizeof(struct wal_item_header);
                // free key & header
                free(header->key);
                free(header);
            } else {
                node = avl_next(node);
            }
        }
        spin_unlock(&old_file->wal->key_shards[i].lock);
    }
    atomic_sub_uint64_t(&old_file->wal->mem_overhead, mem_overhead,
                        std::memory_order_relaxed);

    spin_lock(&old_file->wal->lock);

    // migrate all entries in txn list
    e = list_begin(&old_file->wal->txn_list);
    while(e) {
        txn_wrapper = _get_entry(e, struct wal_txn_wrapper, le);
        txn = txn_wrapper->txn;
        // except for global_txn
        if (txn != &old_file->global_txn) {
            e = list_remove(&old_file->wal->txn_list, &txn_wrapper->le);
            list_push_front(&new_file->wal->txn_list, &txn_wrapper->le);
            // remove previous header info & revnum
            txn->prev_hdr_bid = BLK_NOT_FOUND;
            txn->prev_revnum = 0;
        } else {
            e = list_next(e);
        }
    }

    spin_unlock(&old_file->wal->lock);

    return FDB_RESULT_SUCCESS;
}